

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robotKuka.cpp
# Opt level: O0

void split_pose(Pose pose,double time,RobotKuka *robotKuka)

{
  int iVar1;
  ostream *poVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int e;
  int local_50;
  undefined1 local_4c [4];
  int i;
  Pose package_speed;
  Pose package_move;
  int packages_ammount;
  RobotKuka *robotKuka_local;
  double time_local;
  
  iVar1 = (int)((float)(int)time / robotKuka->CYCLE_TIME);
  fVar3 = Pose::get_x(&pose);
  fVar4 = Pose::get_y(&pose);
  fVar5 = Pose::get_z(&pose);
  fVar6 = Pose::get_a(&pose);
  fVar7 = Pose::get_b(&pose);
  fVar8 = Pose::get_c(&pose);
  Pose::Pose((Pose *)&package_speed.b,fVar3 / (float)iVar1,fVar4 / (float)iVar1,fVar5 / (float)iVar1
             ,fVar6 / (float)iVar1,fVar7 / (float)iVar1,fVar8 / (float)iVar1);
  fVar8 = Pose::get_x((Pose *)&package_speed.b);
  fVar3 = robotKuka->CYCLE_TIME;
  fVar9 = Pose::get_y((Pose *)&package_speed.b);
  fVar4 = robotKuka->CYCLE_TIME;
  fVar10 = Pose::get_z((Pose *)&package_speed.b);
  fVar5 = robotKuka->CYCLE_TIME;
  fVar11 = Pose::get_a((Pose *)&package_speed.b);
  fVar6 = robotKuka->CYCLE_TIME;
  fVar12 = Pose::get_b((Pose *)&package_speed.b);
  fVar7 = robotKuka->CYCLE_TIME;
  fVar13 = Pose::get_c((Pose *)&package_speed.b);
  Pose::Pose((Pose *)local_4c,fVar8 / fVar3,fVar9 / fVar4,fVar10 / fVar5,fVar11 / fVar6,
             fVar12 / fVar7,fVar13 / robotKuka->CYCLE_TIME);
  Pose::print((Pose *)local_4c);
  Pose::print(&robotKuka->security_limit_speed);
  fVar3 = Pose::get_x((Pose *)local_4c);
  fVar4 = Pose::get_x(&robotKuka->security_limit_speed);
  if (fVar3 <= fVar4) {
    fVar3 = Pose::get_y((Pose *)local_4c);
    fVar4 = Pose::get_y(&robotKuka->security_limit_speed);
    if (fVar3 <= fVar4) {
      fVar3 = Pose::get_z((Pose *)local_4c);
      fVar4 = Pose::get_z(&robotKuka->security_limit_speed);
      if (fVar3 <= fVar4) {
        fVar3 = Pose::get_a((Pose *)local_4c);
        fVar4 = Pose::get_a(&robotKuka->security_limit_speed);
        if (fVar3 <= fVar4) {
          fVar3 = Pose::get_b((Pose *)local_4c);
          fVar4 = Pose::get_b(&robotKuka->security_limit_speed);
          if (fVar3 <= fVar4) {
            fVar3 = Pose::get_c((Pose *)local_4c);
            fVar4 = Pose::get_c(&robotKuka->security_limit_speed);
            if (fVar3 <= fVar4) {
              fVar3 = Pose::get_x((Pose *)local_4c);
              fVar4 = Pose::get_x(&robotKuka->security_limit_speed);
              if (fVar3 <= fVar4 / 2.0) {
                fVar3 = Pose::get_y((Pose *)local_4c);
                fVar4 = Pose::get_y(&robotKuka->security_limit_speed);
                if (fVar3 <= fVar4 / 2.0) {
                  fVar3 = Pose::get_z((Pose *)local_4c);
                  fVar4 = Pose::get_z(&robotKuka->security_limit_speed);
                  if (fVar3 <= fVar4 / 2.0) {
                    fVar3 = Pose::get_a((Pose *)local_4c);
                    fVar4 = Pose::get_a(&robotKuka->security_limit_speed);
                    if (fVar3 <= fVar4 / 2.0) {
                      fVar3 = Pose::get_b((Pose *)local_4c);
                      fVar4 = Pose::get_b(&robotKuka->security_limit_speed);
                      if (fVar3 <= fVar4 / 2.0) {
                        fVar3 = Pose::get_c((Pose *)local_4c);
                        fVar4 = Pose::get_c(&robotKuka->security_limit_speed);
                        if (fVar3 <= fVar4 / 2.0) goto LAB_001098c5;
                      }
                    }
                  }
                }
              }
              poVar2 = std::operator<<((ostream *)&std::cout,
                                       "WARNING | Security: half of security_limit_speed exceeded while planning path. Check the log."
                                      );
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              goto LAB_001098c5;
            }
          }
        }
      }
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "ERROR | Security: security_limit_speed exceeded while planning path. Check the log."
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  RobotKuka::stopCommunicator(robotKuka);
LAB_001098c5:
  for (local_50 = 0; local_50 < iVar1; local_50 = local_50 + 1) {
    std::queue<Pose,_std::deque<Pose,_std::allocator<Pose>_>_>::push
              (&robotKuka->move_queue,(value_type *)&package_speed.b);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"LOG | ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," elements pushed to move_queue.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pthread_exit((void *)0x0);
}

Assistant:

void split_pose(Pose pose, double time, RobotKuka* robotKuka)
{
	int packages_ammount = (int) time/robotKuka->CYCLE_TIME;

	Pose package_move(	pose.get_x()/packages_ammount, 
						pose.get_y()/packages_ammount, 
						pose.get_z()/packages_ammount, 
						pose.get_a()/packages_ammount, 
						pose.get_b()/packages_ammount, 
						pose.get_c()/packages_ammount);

	Pose package_speed(	package_move.get_x()/robotKuka->CYCLE_TIME, 
						package_move.get_y()/robotKuka->CYCLE_TIME, 
						package_move.get_z()/robotKuka->CYCLE_TIME, 
						package_move.get_a()/robotKuka->CYCLE_TIME, 
						package_move.get_b()/robotKuka->CYCLE_TIME, 
						package_move.get_c()/robotKuka->CYCLE_TIME);

	package_speed.print();

	robotKuka->security_limit_speed.print();

	if(package_speed.get_x() > robotKuka->security_limit_speed.get_x() || 
	   package_speed.get_y() > robotKuka->security_limit_speed.get_y() || 
	   package_speed.get_z() > robotKuka->security_limit_speed.get_z() || 
	   package_speed.get_a() > robotKuka->security_limit_speed.get_a() || 
	   package_speed.get_b() > robotKuka->security_limit_speed.get_b() || 
	   package_speed.get_c() > robotKuka->security_limit_speed.get_c())
	{
		std::cout << "ERROR | Security: security_limit_speed exceeded while planning path. Check the log." << std::endl;
		robotKuka->stopCommunicator();
	} else if(package_speed.get_x() > robotKuka->security_limit_speed.get_x()/2 || 
	   		  package_speed.get_y() > robotKuka->security_limit_speed.get_y()/2 || 
	   		  package_speed.get_z() > robotKuka->security_limit_speed.get_z()/2 || 
	   		  package_speed.get_a() > robotKuka->security_limit_speed.get_a()/2 || 
	   		  package_speed.get_b() > robotKuka->security_limit_speed.get_b()/2 || 
	   		  package_speed.get_c() > robotKuka->security_limit_speed.get_c()/2)
	{
		std::cout << "WARNING | Security: half of security_limit_speed exceeded while planning path. Check the log." << std::endl;
	}

	for(int i = 0; i < packages_ammount; i++)
	{
		try
		{
			robotKuka->move_queue.push(package_move);
		}
		catch(int e)
		{
			std::cout << "ERROR | Exception: problem while pushing element to move_queue (" << e << ") . Check the log." << std::endl;
		}
	}

	std::cout << "LOG | " << packages_ammount << " elements pushed to move_queue." << std::endl;

	pthread_exit(NULL);
}